

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawInventoryBar::CommandDrawInventoryBar(CommandDrawInventoryBar *this,SBarInfo *script)

{
  SBarInfo *script_local;
  CommandDrawInventoryBar *this_local;
  
  SBarInfoCommand::SBarInfoCommand(&this->super_SBarInfoCommand,script);
  (this->super_SBarInfoCommand)._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawInventoryBar_00a06ba8;
  this->style = STYLE_Doom;
  this->size = 7;
  this->alwaysShow = false;
  this->noArtibox = false;
  this->noArrows = false;
  this->alwaysShowCounter = false;
  this->translucent = false;
  this->vertical = false;
  this->shadow = false;
  this->shadowX = 2;
  this->shadowY = 2;
  this->counters = (CommandDrawNumber **)0x0;
  this->font = (FFont *)0x0;
  this->translation = CR_GOLD;
  this->fontSpacing = 0;
  return;
}

Assistant:

CommandDrawInventoryBar(SBarInfo *script) : SBarInfoCommand(script),
			style(STYLE_Doom), size(7), alwaysShow(false), noArtibox(false),
			noArrows(false), alwaysShowCounter(false), translucent(false),
			vertical(false), shadow(false), shadowX(2), shadowY(2),
			counters(NULL), font(NULL), translation(CR_GOLD),
			fontSpacing(0)
		{
		}